

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void kshiftlb(PDISASM pMyDisasm)

{
  ulong uVar1;
  uint uVar2;
  undefined8 uVar3;
  
  if (((((pMyDisasm->Reserved_).EVEX.state != '\x01') &&
       ((pMyDisasm->Reserved_).VEX.state == '\x01')) && ((pMyDisasm->Reserved_).VEX.L == '\0')) &&
     ((pMyDisasm->Reserved_).VEX.pp == '\x01')) {
    uVar1 = (pMyDisasm->Reserved_).EndOfBlock;
    if ((uVar1 != 0) && (uVar1 < (pMyDisasm->Reserved_).EIP_ + 2)) {
      (pMyDisasm->Reserved_).OutOfBlock = 1;
      (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
      return;
    }
    uVar2 = (uint)(*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6);
    (pMyDisasm->Reserved_).MOD_ = uVar2;
    if (uVar2 == 3) {
      (pMyDisasm->Instruction).Category = 0x140000;
      if ((pMyDisasm->Reserved_).REX.W_ == '\0') {
        uVar3 = 0x626c74666968736b;
      }
      else {
        uVar3 = 0x776c74666968736b;
      }
      *(undefined8 *)(pMyDisasm->Instruction).Mnemonic = uVar3;
      (pMyDisasm->Instruction).Mnemonic[8] = '\0';
      (pMyDisasm->Reserved_).Register_ = 0x400;
      GxEx(pMyDisasm);
      getImmediat8(&pMyDisasm->Operand3,pMyDisasm);
      return;
    }
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
  (pMyDisasm->Operand1).AccessMode = 0;
  (pMyDisasm->Operand2).AccessMode = 0;
  (pMyDisasm->Operand3).AccessMode = 0;
  (pMyDisasm->Operand4).AccessMode = 0;
  (pMyDisasm->Operand5).AccessMode = 0;
  (pMyDisasm->Operand6).AccessMode = 0;
  (pMyDisasm->Operand7).AccessMode = 0;
  (pMyDisasm->Operand8).AccessMode = 0;
  (pMyDisasm->Operand9).AccessMode = 0;
  (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  return;
}

Assistant:

void __bea_callspec__ kshiftlb(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
  }
  else if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.L == 0) {
      if (GV.VEX.pp == 1) {
        if (!Security(2, pMyDisasm)) return;
        GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
        if (GV.MOD_ != 0x3) { failDecode(pMyDisasm); return; }

        pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
        if (GV.REX.W_ == 0) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kshiftlb");
          #endif
        }
        else {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "kshiftlw");
          #endif
        }
        GV.Register_ = OPMASK_REG;
        GxEx(pMyDisasm);
        getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
}